

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O3

void anurbs::Ref<anurbs::BrepFace>::register_python(module *m)

{
  long *plVar1;
  undefined8 *puVar2;
  class_<anurbs::Ref<anurbs::BrepFace>> *pcVar3;
  ulong uVar4;
  string name;
  type local_a2;
  type local_a1;
  class_<anurbs::Ref<anurbs::BrepFace>_> local_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  code *local_78;
  long local_70;
  ulong local_68 [2];
  code *local_58;
  undefined8 local_50;
  long local_48;
  undefined1 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  
  local_78 = (code *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Ref","");
  local_48 = 0x6563614670657242;
  local_50 = 8;
  local_40 = 0;
  uVar4 = 0xf;
  if (local_78 != (code *)local_68) {
    uVar4 = local_68[0];
  }
  local_58 = (code *)&local_48;
  if ((local_70 + 8U < 0x10) && (uVar4 < local_70 + 8U)) {
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
  }
  else {
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)&local_48);
  }
  local_98 = &local_88;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_88 = *plVar1;
    uStack_80 = puVar2[3];
  }
  else {
    local_88 = *plVar1;
    local_98 = (long *)*puVar2;
  }
  local_90 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_58 != (code *)&local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78 != (code *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  pybind11::class_<anurbs::Ref<anurbs::BrepFace>_>::class_<>
            (&local_a0,(m->super_object).super_handle.m_ptr,(char *)local_98);
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepFace>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepFace>>::
           def<anurbs::Ref<anurbs::BrepFace>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::BrepFace>const&)_1_>
                     ((class_<anurbs::Ref<anurbs::BrepFace>> *)&local_a0,"__len__",&local_a1);
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepFace>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepFace>>::
           def<anurbs::Ref<anurbs::BrepFace>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::BrepFace>const&,int)_1_>
                     (pcVar3,"__getitem__",&local_a2);
  local_78 = key_abi_cxx11_;
  local_70 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepFace>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepFace>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::BrepFace>::*)()const>
                     (pcVar3,"key",(offset_in_Model_to_subr *)&local_78);
  local_58 = type_name_abi_cxx11_;
  local_50 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepFace>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepFace>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::BrepFace>::*)()const>
                     (pcVar3,"type",(offset_in_Model_to_subr *)&local_58);
  local_28 = data;
  local_20 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepFace>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepFace>>::
           def_property_readonly<std::shared_ptr<anurbs::BrepFace>(anurbs::Ref<anurbs::BrepFace>::*)()const>
                     (pcVar3,"data",(offset_in_Model_to_subr *)&local_28);
  local_38 = attributes;
  local_30 = 0;
  pybind11::class_<anurbs::Ref<anurbs::BrepFace>>::
  def_property_readonly<std::shared_ptr<anurbs::Attributes>(anurbs::Ref<anurbs::BrepFace>::*)()const>
            (pcVar3,"attributes",(offset_in_Model_to_subr *)&local_38);
  pybind11::object::~object((object *)&local_a0);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = std::string("Ref") + TData::type_name();

        py::class_<Type>(m, name.c_str())
            // methods
            .def("__len__", [](const Type& self) { return 2; })
            .def("__getitem__", [](const Type& self, const int i) -> py::object {
                switch (i) {
                case 0:
                    return py::cast(self.key());
                case 1:
                    return py::cast(self.data());
                default:
                    throw py::index_error();
                }
            })
            // read-only properties
            .def_property_readonly("key", &Type::key)
            .def_property_readonly("type", &Type::type_name)
            .def_property_readonly("data", &Type::data)
            .def_property_readonly("attributes", &Type::attributes)
        ;
    }